

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

void lj_trace_freestate(global_State *g)

{
  uint uVar1;
  void *pvVar2;
  lua_CFunction p_Var3;
  long lVar4;
  ulong uVar5;
  
  lj_mcode_free((jit_State *)(g + 1));
  pvVar2 = *(void **)&g[1].bc_cfunc_int;
  uVar5 = (ulong)(uint)g[1].cur_L.gcptr64;
  (g->gc).total = (g->gc).total + uVar5 * -4;
  (*g->allocf)(g->allocd,pvVar2,uVar5 * 4,0);
  p_Var3 = g[1].panic;
  uVar5 = (ulong)*(uint *)((long)&g[1].wrapf + 4);
  (g->gc).total = (g->gc).total + uVar5 * -0xc;
  (*g->allocf)(g->allocd,p_Var3,uVar5 * 0xc,0);
  uVar1 = *(uint *)((long)&g[1].hookf + 4);
  uVar5 = (ulong)(*(int *)&g[1].hookf - uVar1);
  lVar4 = *(long *)&g[1].hookcount;
  (g->gc).total = (g->gc).total + uVar5 * -8;
  (*g->allocf)(g->allocd,(void *)((ulong)uVar1 * 8 + lVar4),uVar5 * 8,0);
  pvVar2 = (void *)g[1].ctype_state.ptr64;
  uVar5 = (ulong)*(uint *)((long)g[1].prng.u + 4);
  (g->gc).total = (g->gc).total + uVar5 * -8;
  (*g->allocf)(g->allocd,pvVar2,uVar5 * 8,0);
  return;
}

Assistant:

void lj_trace_freestate(global_State *g)
{
  jit_State *J = G2J(g);
#ifdef LUA_USE_ASSERT
  {  /* This assumes all traces have already been freed. */
    ptrdiff_t i;
    for (i = 1; i < (ptrdiff_t)J->sizetrace; i++)
      lj_assertG(i == (ptrdiff_t)J->cur.traceno || traceref(J, i) == NULL,
		 "trace still allocated");
  }
#endif
  lj_mcode_free(J);
  lj_mem_freevec(g, J->snapmapbuf, J->sizesnapmap, SnapEntry);
  lj_mem_freevec(g, J->snapbuf, J->sizesnap, SnapShot);
  lj_mem_freevec(g, J->irbuf + J->irbotlim, J->irtoplim - J->irbotlim, IRIns);
  lj_mem_freevec(g, J->trace, J->sizetrace, GCRef);
}